

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser9::Run(UnitTest_parser9 *this)

{
  bool bVar1;
  byte bVar2;
  string *in_stack_ffffffffffffff48;
  allocator *paVar3;
  undefined7 in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [8];
  string *in_stack_ffffffffffffff78;
  UnitTestBase *in_stack_ffffffffffffff80;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"f:m()",&local_31);
  anon_unknown.dwarf_4b09::Parse(in_stack_ffffffffffffff48);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x19c9bd);
  bVar2 = bVar1 ^ 0xff;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             (CONCAT17(bVar1,in_stack_ffffffffffffff50) ^ 0xff00000000000000));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((bVar2 & 1) != 0) {
    paVar3 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"\'Parse(\"f:m()\")\'",paVar3);
    UnitTestBase::Error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  bVar1 = anon_unknown.dwarf_4b09::IsEOF();
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"\'IsEOF()\'",&local_91);
    UnitTestBase::Error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return;
}

Assistant:

TEST_CASE(parser9)
{
    EXPECT_TRUE(Parse("f:m()"));
    EXPECT_TRUE(IsEOF());
}